

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  ushort uVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImGuiID id;
  uint uVar10;
  ImU32 IVar11;
  ImU32 IVar12;
  ImGuiMouseCursor IVar13;
  ImGuiIO *pIVar14;
  ImGuiViewport *pIVar15;
  ImDrawList *pIVar16;
  ImGuiStyle *pIVar17;
  undefined1 auVar18 [8];
  ImGuiKeyData *pIVar19;
  char cVar20;
  long lVar21;
  ulong uVar22;
  int obj_i;
  bool *pbVar23;
  int i;
  int iVar24;
  ImGuiWindowFlags flags;
  int n;
  ulong uVar25;
  char *pcVar26;
  char *pcVar27;
  int doc_n_1;
  int num_segments;
  int doc_n;
  int i_5;
  undefined8 *puVar28;
  MyDocument *doc_00;
  int i_3;
  long lVar29;
  undefined **ppuVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar34;
  uint uVar35;
  float local_158;
  float fStack_154;
  ImVec2 canvas_sz;
  ImVec2 local_140;
  ImVec2 local_138 [2];
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  ImVec2 gradient_size;
  ImVec2 local_108;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  MyDocument *doc;
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_58;
  float local_4c;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if ((ShowDemoWindow::show_app_main_menu_bar) && (bVar7 = BeginMainMenuBar(), bVar7)) {
    bVar7 = BeginMenu("File",true);
    if (bVar7) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar7 = BeginMenu("Edit",true);
    if (bVar7) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar24 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar24 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar7 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar7) {
      bVar7 = BeginMenuBar();
      if (bVar7) {
        bVar7 = BeginMenu("File",true);
        if (bVar7) {
          lVar21 = 0;
          uVar25 = 0;
          if (0 < (int)ShowExampleAppDocuments(bool*)::app) {
            uVar25 = (ulong)ShowExampleAppDocuments(bool*)::app;
          }
          iVar24 = 0;
          for (; uVar25 * 0x20 != lVar21; lVar21 = lVar21 + 0x20) {
            iVar24 = iVar24 + (uint)*(byte *)(DAT_001aa3b8 + 8 + lVar21);
          }
          bVar7 = BeginMenu("Open",iVar24 < (int)ShowExampleAppDocuments(bool*)::app);
          if (bVar7) {
            lVar21 = 8;
            uVar10 = ShowExampleAppDocuments(bool*)::app;
            for (lVar29 = 0; lVar6 = DAT_001aa3b8, lVar29 < (int)uVar10; lVar29 = lVar29 + 1) {
              if ((*(char *)(DAT_001aa3b8 + lVar21) == '\0') &&
                 (bVar7 = MenuItem(*(char **)(DAT_001aa3b8 + -8 + lVar21),(char *)0x0,false,true),
                 uVar10 = ShowExampleAppDocuments(bool*)::app, bVar7)) {
                *(undefined1 *)(lVar6 + lVar21) = 1;
              }
              lVar21 = lVar21 + 0x20;
            }
            EndMenu();
          }
          uVar25 = 0;
          bVar7 = MenuItem("Close All Documents",(char *)0x0,false,iVar24 != 0);
          lVar21 = DAT_001aa3b8;
          if (bVar7) {
            uVar22 = (ulong)ShowExampleAppDocuments(bool*)::app;
            if ((int)ShowExampleAppDocuments(bool*)::app < 1) {
              uVar22 = uVar25;
            }
            for (; uVar22 * 0x20 != uVar25; uVar25 = uVar25 + 0x20) {
              *(undefined1 *)(lVar21 + 0xb + uVar25) = 1;
            }
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      lVar21 = 8;
      local_58 = p_open;
      for (lVar29 = 0; lVar6 = DAT_001aa3b8, lVar29 < (int)ShowExampleAppDocuments(bool*)::app;
          lVar29 = lVar29 + 1) {
        if (lVar21 != 8) {
          SameLine(0.0,-1.0);
        }
        puVar28 = (undefined8 *)(lVar21 + lVar6 + -8);
        PushID(puVar28);
        bVar7 = Checkbox((char *)*puVar28,(bool *)(lVar21 + lVar6));
        if ((bVar7) && (*(bool *)(lVar21 + lVar6) == false)) {
          *(undefined1 *)(lVar6 + lVar21) = 0;
          *(undefined1 *)(lVar6 + 2 + lVar21) = 0;
        }
        PopID();
        lVar21 = lVar21 + 0x20;
      }
      Separator();
      bVar7 = BeginTabBar("##tabs",0x41);
      p_open = local_58;
      if (bVar7) {
        lVar21 = 9;
        uVar10 = ShowExampleAppDocuments(bool*)::app;
        for (lVar29 = 0; lVar6 = DAT_001aa3b8, lVar29 < (int)uVar10; lVar29 = lVar29 + 1) {
          cVar20 = *(char *)(DAT_001aa3b8 + -1 + lVar21);
          if ((cVar20 == '\0') && (*(char *)(DAT_001aa3b8 + lVar21) == '\x01')) {
            SetTabItemClosed(*(char **)(DAT_001aa3b8 + -9 + lVar21));
            cVar20 = *(char *)(lVar6 + -1 + lVar21);
            uVar10 = ShowExampleAppDocuments(bool*)::app;
          }
          *(char *)(lVar6 + lVar21) = cVar20;
          lVar21 = lVar21 + 0x20;
        }
        lVar21 = 8;
        for (lVar29 = 0; lVar6 = DAT_001aa3b8, lVar29 < (int)uVar10; lVar29 = lVar29 + 1) {
          if (*(char *)(DAT_001aa3b8 + lVar21) == '\x01') {
            bVar7 = BeginTabItem(*(char **)(DAT_001aa3b8 + -8 + lVar21),
                                 (bool *)(DAT_001aa3b8 + lVar21),
                                 (uint)*(byte *)(DAT_001aa3b8 + 2 + lVar21));
            if ((*(char *)(lVar6 + lVar21) == '\0') && (*(char *)(lVar6 + 2 + lVar21) == '\x01')) {
              *(undefined1 *)(lVar6 + lVar21) = 1;
              *(undefined1 *)(lVar6 + 3 + lVar21) = 1;
            }
            doc_00 = (MyDocument *)(lVar6 + lVar21 + -8);
            MyDocument::DisplayContextMenu(doc_00);
            if (bVar7) {
              MyDocument::DisplayContents(doc_00);
              EndTabItem();
            }
          }
          lVar21 = lVar21 + 0x20;
          uVar10 = ShowExampleAppDocuments(bool*)::app;
        }
        EndTabBar();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == '\0') &&
         (iVar24 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::close_queue), iVar24 != 0))
      {
        _close_queue = 0;
        DAT_001aa3d0 = 0;
        __cxa_atexit(ImVector<MyDocument_*>::~ImVector,&ShowExampleAppDocuments(bool*)::close_queue,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppDocuments(bool*)::close_queue);
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        lVar29 = 0;
        uVar10 = ShowExampleAppDocuments(bool*)::app;
        for (lVar21 = 0; lVar21 < (int)uVar10; lVar21 = lVar21 + 1) {
          doc = (MyDocument *)(DAT_001aa3b8 + lVar29);
          if (*(char *)(DAT_001aa3b8 + 0xb + lVar29) == '\x01') {
            *(undefined1 *)(DAT_001aa3b8 + 0xb + lVar29) = 0;
            ImVector<MyDocument_*>::push_back
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue,&doc);
            uVar10 = ShowExampleAppDocuments(bool*)::app;
          }
          lVar29 = lVar29 + 0x20;
        }
        if (ShowExampleAppDocuments(bool*)::close_queue == 0) goto LAB_0012e0ca;
      }
      lVar21 = DAT_001aa3d0;
      uVar22 = 0;
      uVar25 = (ulong)ShowExampleAppDocuments(bool*)::close_queue;
      if ((int)ShowExampleAppDocuments(bool*)::close_queue < 1) {
        uVar25 = uVar22;
      }
      iVar24 = 0;
      for (; uVar25 != uVar22; uVar22 = uVar22 + 1) {
        iVar24 = iVar24 + (uint)*(byte *)(*(long *)(DAT_001aa3d0 + uVar22 * 8) + 10);
      }
      if (iVar24 == 0) {
        for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
          lVar29 = *(long *)(lVar21 + uVar22 * 8);
          *(undefined1 *)(lVar29 + 8) = 0;
          *(undefined1 *)(lVar29 + 10) = 0;
        }
        ImVector<MyDocument_*>::clear
                  ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
      }
      else {
        bVar7 = IsPopupOpen("Save?",0);
        if (!bVar7) {
          OpenPopup("Save?",0);
        }
        bVar7 = BeginPopupModal("Save?",(bool *)0x0,0x40);
        if (bVar7) {
          Text("Save change to the following items?");
          fVar31 = GetTextLineHeightWithSpacing();
          id = GetID("frame");
          doc = (MyDocument *)CONCAT44(fVar31 * 6.25,0x80800000);
          bVar7 = BeginChildFrame(id,(ImVec2 *)&doc,0);
          if (bVar7) {
            uVar10 = ShowExampleAppDocuments(bool*)::close_queue;
            for (lVar21 = 0; lVar21 < (int)uVar10; lVar21 = lVar21 + 1) {
              puVar28 = *(undefined8 **)(DAT_001aa3d0 + lVar21 * 8);
              if (*(char *)((long)puVar28 + 10) == '\x01') {
                Text("%s",*puVar28);
                uVar10 = ShowExampleAppDocuments(bool*)::close_queue;
              }
            }
            EndChildFrame();
          }
          fVar31 = GetFontSize();
          doc = (MyDocument *)(ulong)(uint)(fVar31 * 7.0);
          bVar7 = Button("Yes",(ImVec2 *)&doc);
          lVar21 = DAT_001aa3d0;
          if (bVar7) {
            uVar25 = _close_queue & 0xffffffff;
            if ((int)ShowExampleAppDocuments(bool*)::close_queue < 1) {
              uVar25 = 0;
            }
            for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
              lVar29 = *(long *)(lVar21 + uVar22 * 8);
              if (*(char *)(lVar29 + 10) == '\x01') {
                *(undefined1 *)(lVar29 + 10) = 0;
              }
              *(undefined1 *)(lVar29 + 8) = 0;
              *(undefined1 *)(lVar29 + 10) = 0;
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          bVar7 = Button("No",(ImVec2 *)&doc);
          lVar21 = DAT_001aa3d0;
          if (bVar7) {
            uVar25 = _close_queue & 0xffffffff;
            if ((int)ShowExampleAppDocuments(bool*)::close_queue < 1) {
              uVar25 = 0;
            }
            for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
              lVar29 = *(long *)(lVar21 + uVar22 * 8);
              *(undefined1 *)(lVar29 + 8) = 0;
              *(undefined1 *)(lVar29 + 10) = 0;
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          bVar7 = Button("Cancel",(ImVec2 *)&doc);
          if (bVar7) {
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          EndPopup();
        }
      }
    }
LAB_0012e0ca:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar24 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar24 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar24 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar24 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    doc = (MyDocument *)0x43c8000043fa0000;
    local_58 = p_open;
    SetNextWindowSize((ImVec2 *)&doc,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b2d,"Examples/Log",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = SmallButton("[Debug] Add 5 entries");
    if (bVar7) {
      iVar24 = 5;
      while (bVar7 = iVar24 != 0, iVar24 = iVar24 + -1, bVar7) {
        uVar10 = GetFrameCount();
        dVar3 = GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",
                   SUB84(dVar3,0),(ulong)uVar10);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
      }
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_58;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    doc = (MyDocument *)0x43dc000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar7 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1b4c,"Examples/Simple layout",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = BeginMenuBar();
      if (bVar7) {
        bVar7 = BeginMenu("File",true);
        if (bVar7) {
          bVar7 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar7) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      doc = (MyDocument *)0x43160000;
      BeginChild("left pane",(ImVec2 *)&doc,true,0);
      uVar25 = 0;
      while (iVar24 = (int)uVar25, iVar24 != 100) {
        sprintf((char *)&doc,"MyObject %d",uVar25);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar7 = Selectable((char *)&doc,iVar24 == ShowExampleAppLayout(bool*)::selected,0,&canvas_sz
                          );
        if (bVar7) {
          ShowExampleAppLayout(bool*)::selected = iVar24;
        }
        uVar25 = (ulong)(iVar24 + 1);
      }
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar31 = GetFrameHeightWithSpacing();
      doc = (MyDocument *)((ulong)(uint)fVar31 << 0x20 ^ 0x8000000000000000);
      BeginChild("item view",(ImVec2 *)&doc,false,0);
      Text("MyObject: %d");
      Separator();
      bVar7 = BeginTabBar("##Tabs",0);
      if (bVar7) {
        bVar7 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar7) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar7 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar7) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      doc = (MyDocument *)0x0;
      Button("Revert",(ImVec2 *)&doc);
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      Button("Save",(ImVec2 *)&doc);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    doc = (MyDocument *)0x43e1000043d70000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar7 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1bc1,"Examples/Property Editor",GImGuiDemoMarkerCallbackUserData);
      }
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      doc = (MyDocument *)0x4000000040000000;
      PushStyleVar(0xb,(ImVec2 *)&doc);
      doc = (MyDocument *)0x0;
      bVar7 = BeginTable("split",2,0x501,(ImVec2 *)&doc,0.0);
      if (bVar7) {
        for (iVar24 = 0; iVar24 != 4; iVar24 = iVar24 + 1) {
          ShowPlaceholderObject("Object",iVar24);
        }
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    doc = (MyDocument *)0x4416000044020000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar7 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1be5,"Examples/Long text display",GImGuiDemoMarkerCallbackUserData);
      }
      if ((ShowExampleAppLongText(bool*)::log == '\0') &&
         (iVar24 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar24 != 0)) {
        _log = 0;
        DAT_001aa360 = (char *)0x0;
        __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText(bool*)::log,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar25 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar25 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar25)
      ;
      doc = (MyDocument *)0x0;
      bVar7 = Button("Clear",(ImVec2 *)&doc);
      if (bVar7) {
        ImVector<char>::clear((ImVector<char> *)&ShowExampleAppLongText(bool*)::log);
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      bVar7 = Button("Add 1000 lines",(ImVec2 *)&doc);
      if (bVar7) {
        for (iVar24 = 0; iVar24 != 1000; iVar24 = iVar24 + 1) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar24));
        }
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      doc = (MyDocument *)0x0;
      BeginChild("Log",(ImVec2 *)&doc,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xe,(ImVec2 *)&doc);
        for (iVar24 = 0; iVar24 < (int)ShowExampleAppLongText(bool*)::lines; iVar24 = iVar24 + 1) {
          Text("%i The quick brown fox jumps over the lazy dog");
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xe,(ImVec2 *)&doc);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)&doc);
        ImGuiListClipper::Begin((ImGuiListClipper *)&doc,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)&doc), bVar7) {
          for (iVar24 = (int)doc._0_4_; iVar24 < (int)doc._4_4_; iVar24 = iVar24 + 1) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)&doc);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar26 = DAT_001aa360 + (long)ShowExampleAppLongText(bool*)::log + -1;
        pcVar27 = DAT_001aa360;
        if (DAT_001aa360 == (char *)0x0) {
          pcVar27 = ImGuiTextBuffer::EmptyString;
          pcVar26 = ImGuiTextBuffer::EmptyString;
        }
        TextUnformatted(pcVar27,pcVar26);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar7 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c23,"Examples/Auto-resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      uVar25 = 0;
      for (iVar24 = 0; iVar24 < ShowExampleAppAutoResize(bool*)::lines; iVar24 = iVar24 + 1) {
        Text("%*sThis is line %d",uVar25,"");
        uVar25 = (ulong)((int)uVar25 + 4);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x17fb76;
    IStack_c0 = (ImVec2)0x17fb90;
    doc = (MyDocument *)anon_var_dwarf_61816;
    IStack_d0 = (ImVec2)0x17fb5f;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 0.0;
      gradient_size.x = -1.0;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      canvas_sz.x = 0.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      canvas_sz.x = 100.0;
      canvas_sz.y = 100.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      canvas_sz.x = 400.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 500.0;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 400.0;
      gradient_size.x = -1.0;
      gradient_size.y = 500.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 &DAT_00000064);
    }
    bVar7 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c57,"Examples/Constrained Resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar7 = Button("200x200",&canvas_sz);
      if (bVar7) {
        canvas_sz.x = 200.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar7 = Button("500x500",&canvas_sz);
      if (bVar7) {
        canvas_sz.x = 500.0;
        canvas_sz.y = 500.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar7 = Button("800x200",&canvas_sz);
      if (bVar7) {
        canvas_sz.x = 800.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)&doc,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      uVar10 = 0;
      for (iVar24 = 0; iVar24 < ShowExampleAppConstrainedResize(bool*)::display_lines;
          iVar24 = iVar24 + 1) {
        Text("%*sHello, sailor! Making this line long enough for the example.",(ulong)uVar10,"");
        uVar10 = uVar10 + 4;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar14 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      pIVar15 = GetMainViewport();
      fVar31 = (pIVar15->WorkPos).x;
      fVar33 = (pIVar15->WorkPos).y;
      uVar10 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0);
      uVar35 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0);
      doc = (MyDocument *)
            (CONCAT44(~uVar35 & (uint)((pIVar15->WorkSize).y + fVar33 + -10.0),
                      ~uVar10 & (uint)((pIVar15->WorkSize).x + fVar31 + -10.0)) |
            CONCAT44((uint)(fVar33 + 10.0) & uVar35,(uint)(fVar31 + 10.0) & uVar10));
      uVar25 = CONCAT44(~uVar35,~uVar10) & 0x3f8000003f800000;
      canvas_sz.x = (float)uVar25;
      canvas_sz.y = (float)(uVar25 >> 0x20);
      SetNextWindowPos((ImVec2 *)&doc,1,&canvas_sz);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar7 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c82,"Examples/Simple Overlay",GImGuiDemoMarkerCallbackUserData);
      }
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar7 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar7) {
        Text("Mouse Position: (%.1f,%.1f)",SUB84((double)(pIVar14->MousePos).x,0));
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar7 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar7) {
        bVar7 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar7) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar7 = MenuItem("Top-left",(char *)0x0,!bVar7 && uVar10 == 0,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar7) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar7 = MenuItem("Top-right",(char *)0x0,!bVar7 && uVar10 == 1,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar7) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar7 = MenuItem("Bottom-left",(char *)0x0,!bVar7 && uVar10 == 2,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar7) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar7 = MenuItem("Bottom-right",(char *)0x0,!bVar7 && uVar10 == 3,true);
        if (bVar7) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar7 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar7) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar15 = GetMainViewport();
    doc = (MyDocument *)0x0;
    SetNextWindowPos(&pIVar15->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)&doc);
    SetNextWindowSize(&pIVar15->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    bVar7 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                  ShowExampleAppFullscreen(bool*)::flags);
    if (bVar7) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      doc = (MyDocument *)0x0;
      bVar7 = Button("Close this window",(ImVec2 *)&doc);
      if (bVar7) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar15 = GetMainViewport();
    fVar31 = (pIVar15->Pos).y;
    local_128._0_4_ = (pIVar15->Pos).x + 100.0;
    local_128._4_4_ = fVar31 + 100.0;
    _fStack_120 = 0;
    doc = (MyDocument *)CONCAT44(fVar31 + 100.0,local_128._0_4_);
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##1",(bool *)0x0,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ccd,"Examples/Manipulating window titles",GImGuiDemoMarkerCallbackUserData);
    }
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    doc = (MyDocument *)CONCAT44(fVar31 + 200.0,local_128._0_4_);
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar3 = GetTime();
    cVar20 = "|/-\\"[(int)(dVar3 * 4.0) & 3];
    GetFrameCount();
    sprintf((char *)&doc,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar20);
    canvas_sz.y = fVar31 + 300.0;
    canvas_sz.x = (float)local_128._0_4_;
    gradient_size.x = 0.0;
    gradient_size.y = 0.0;
    SetNextWindowPos(&canvas_sz,4,&gradient_size);
    Begin((char *)&doc,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_00130405;
  bVar7 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if (bVar7) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ceb,"Examples/Custom Rendering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = BeginTabBar("##TabBar",0);
    if (bVar7) {
      iVar24 = 0;
      bVar7 = BeginTabItem("Primitives",(bool *)0x0,0);
      if (bVar7) {
        local_58 = p_open;
        fVar31 = GetFontSize();
        PushItemWidth(fVar31 * -15.0);
        pIVar16 = GetWindowDrawList();
        Text("Gradients");
        fVar31 = CalcItemWidth();
        local_128._0_4_ = GetFrameHeight();
        local_128._4_4_ = extraout_XMM0_Db;
        fStack_120 = (float)extraout_XMM0_Dc;
        fStack_11c = (float)extraout_XMM0_Dd;
        gradient_size.y = (float)local_128._0_4_;
        gradient_size.x = fVar31;
        doc = (MyDocument *)GetCursorScreenPos();
        canvas_sz.x = fVar31 + SUB84(doc,0);
        canvas_sz.y = (float)local_128._0_4_ + SUB84(doc,4);
        IVar11 = GetColorU32(0xff000000);
        IVar12 = GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,IVar12,IVar12,IVar11);
        InvisibleButton("##gradient1",&gradient_size,0);
        doc = (MyDocument *)GetCursorScreenPos();
        canvas_sz.x = gradient_size.x + SUB84(doc,0);
        canvas_sz.y = gradient_size.y + SUB84(doc,4);
        IVar11 = GetColorU32(0xff00ff00);
        IVar12 = GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,IVar12,IVar12,IVar11);
        InvisibleButton("##gradient2",&gradient_size,0);
        Text("All primitives");
        DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
        DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",
                  0);
        SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
        Checkbox("##circlesegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
        pIVar17 = GetStyle();
        SameLine(0.0,(pIVar17->ItemInnerSpacing).x);
        bVar7 = SliderInt("Circle segments override",
                          &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::circle_segments_override =
             ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar7;
        Checkbox("##curvessegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
        pIVar17 = GetStyle();
        SameLine(0.0,(pIVar17->ItemInnerSpacing).x);
        bVar7 = SliderInt("Curves segments override",
                          &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::curve_segments_override =
             ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar7;
        ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
        IVar4 = GetCursorScreenPos();
        doc = (MyDocument *)ShowExampleAppCustomRendering(bool*)::colf._0_8_;
        IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
        IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
        IVar11 = ColorConvertFloat4ToU32((ImVec4 *)&doc);
        local_dc = 0;
        if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
          local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
        }
        num_segments = 0;
        if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
          num_segments = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
        }
        local_4c = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
        local_158 = IVar4.x;
        fStack_154 = IVar4.y;
        local_48._4_4_ = fStack_154;
        local_48._0_4_ = local_158 + 4.0;
        uStack_40 = extraout_XMM0_Dc_00;
        uStack_3c = extraout_XMM0_Dd_00;
        fVar31 = fStack_154 + 4.0;
        for (; iVar24 != 2; iVar24 = iVar24 + 1) {
          fVar33 = 1.0;
          if (iVar24 != 0) {
            fVar33 = ShowExampleAppCustomRendering(bool*)::thickness;
          }
          local_128._0_4_ = fVar33;
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          doc = (MyDocument *)CONCAT44(fVar32 + fVar31,fVar32 + (float)local_48._0_4_);
          ImDrawList::AddNgon(pIVar16,(ImVec2 *)&doc,fVar32,IVar11,
                              ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar33);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
          fVar33 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          doc = (MyDocument *)CONCAT44(fVar33 + fVar31,fVar33 + fVar32);
          ImDrawList::AddCircle
                    (pIVar16,(ImVec2 *)&doc,fVar33,IVar11,local_dc,(float)local_128._0_4_);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = fVar32 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0,(float)local_128._0_4_)
          ;
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = fVar32 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,local_4c,0,
                              (float)local_128._0_4_);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = fVar32 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,local_4c,0x90,
                              (float)local_128._0_4_);
          fVar32 = fVar32 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar31 + -0.5;
          doc = (MyDocument *)
                CONCAT44(fVar31,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar32);
          canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar32;
          local_e8.y = canvas_sz.y;
          local_e8.x = fVar32;
          ImDrawList::AddTriangle
                    (pIVar16,(ImVec2 *)&doc,&canvas_sz,&local_e8,IVar11,(float)local_128._0_4_);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar32;
          canvas_sz.y = fVar31;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,(float)local_128._0_4_);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar31;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = fVar32;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,(float)local_128._0_4_);
          fVar32 = fVar32 + 10.0;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar32;
          canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar31;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,(float)local_128._0_4_);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          local_140.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar31;
          local_138[0].x = fVar32 + ShowExampleAppCustomRendering(bool*)::sz;
          local_138[0].y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar31;
          local_140.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar32;
          canvas_sz.x = fVar32;
          ImDrawList::AddBezierQuadratic
                    (pIVar16,&canvas_sz,&local_140,local_138,IVar11,(float)local_128._0_4_,
                     num_segments);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar32;
          doc = (MyDocument *)CONCAT44(fVar31,fVar32);
          IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar31;
          IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + fVar32;
          local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                       fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                       ShowExampleAppCustomRendering(bool*)::sz + fVar32;
          IStack_c0.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
          IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + fVar32;
          ImDrawList::AddBezierCubic
                    (pIVar16,(ImVec2 *)&doc,&IStack_d0,&local_c8,&IStack_c0,IVar11,
                     (float)local_128._0_4_,num_segments);
          fVar31 = fVar31 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        }
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar33 + fVar31,fVar33 + (float)local_48._0_4_);
        ImDrawList::AddNgonFilled
                  (pIVar16,(ImVec2 *)&doc,fVar33,IVar11,
                   ShowExampleAppCustomRendering(bool*)::ngon_sides);
        local_48._0_4_ = (float)local_48._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar33 + fVar31,fVar33 + (float)local_48._0_4_);
        ImDrawList::AddCircleFilled(pIVar16,(ImVec2 *)&doc,fVar33,IVar11,local_dc);
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
        _local_128 = ZEXT416((uint)fVar33);
        doc = (MyDocument *)CONCAT44(fVar31,fVar33);
        canvas_sz.x = fVar33 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)fVar33);
        doc = (MyDocument *)CONCAT44(fVar31,fVar33);
        canvas_sz.x = fVar33 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,10.0,0);
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)fVar33);
        doc = (MyDocument *)CONCAT44(fVar31,fVar33);
        canvas_sz.x = fVar33 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,10.0,0x90);
        local_128._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar31 + -0.5;
        local_128._4_4_ = canvas_sz.y;
        fStack_120 = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
        fStack_11c = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
        doc = (MyDocument *)
              CONCAT44(fVar31,ShowExampleAppCustomRendering(bool*)::sz * 0.5 +
                              (float)local_128._0_4_);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        local_e8.y = canvas_sz.y;
        local_e8.x = (float)local_128._0_4_;
        ImDrawList::AddTriangleFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,&local_e8,IVar11);
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)fVar33);
        doc = (MyDocument *)CONCAT44(fVar31,fVar33);
        canvas_sz.x = fVar33 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar31;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
        fVar33 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)fVar33);
        doc = (MyDocument *)CONCAT44(fVar31,fVar33);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::thickness + fVar33;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar31;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
        local_128._0_4_ = (float)local_128._0_4_ + 20.0;
        doc = (MyDocument *)CONCAT44(fVar31,local_128._0_4_);
        canvas_sz.x = (float)local_128._0_4_ + 1.0;
        canvas_sz.y = fVar31 + 1.0;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
        doc = (MyDocument *)
              CONCAT44(fVar31,(float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz);
        canvas_sz.x = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                      ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar31 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)&doc,&canvas_sz,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
        doc = (MyDocument *)
              CONCAT44((ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0,
                       (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2);
        Dummy((ImVec2 *)&doc);
        PopItemWidth();
        EndTabItem();
        p_open = local_58;
      }
      bVar7 = BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar7) {
        if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
           (iVar24 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar24 != 0
           )) {
          _points = 0;
          DAT_001aa390 = 0;
          __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering(bool*)::points,
                       &__dso_handle);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
        }
        Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
        Checkbox("Enable context menu",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
        Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.")
        ;
        doc = (MyDocument *)GetCursorScreenPos();
        IVar4 = GetContentRegionAvail();
        canvas_sz.x = IVar4.x;
        canvas_sz.y = IVar4.y;
        if (canvas_sz.x < 50.0) {
          canvas_sz.x = 50.0;
        }
        if (canvas_sz.y < 50.0) {
          canvas_sz.y = 50.0;
        }
        gradient_size.y = (float)((ulong)doc >> 0x20) + canvas_sz.y;
        gradient_size.x = SUB84(doc,0) + canvas_sz.x;
        pIVar14 = GetIO();
        pIVar16 = GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&gradient_size,0xff323232,0.0,0);
        ImDrawList::AddRect(pIVar16,(ImVec2 *)&doc,&gradient_size,0xffffffff,0.0,0,1.0);
        InvisibleButton("canvas",&canvas_sz,3);
        bVar7 = IsItemHovered(0);
        bVar8 = IsItemActive();
        fVar31 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + SUB84(doc,0);
        fVar33 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + (float)((ulong)doc >> 0x20);
        local_e8.y = (pIVar14->MousePos).y - fVar33;
        local_e8.x = (pIVar14->MousePos).x - fVar31;
        if (bVar7) {
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
            bVar7 = IsMouseClicked(0,false);
            if (!bVar7) goto LAB_0012ffb9;
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
          }
LAB_0012ffc2:
          *(ImVec2 *)(DAT_001aa390 + -8 + (long)ShowExampleAppCustomRendering(bool*)::points * 8) =
               local_e8;
          bVar7 = IsMouseDown(0);
          if (!bVar7) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          }
        }
        else {
LAB_0012ffb9:
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_0012ffc2;
        }
        if (bVar8) {
          if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
            fVar32 = 0.0;
          }
          else {
            fVar32 = -1.0;
          }
          bVar7 = IsMouseDragging(1,fVar32);
          if (bVar7) {
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
                 (pIVar14->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
                 (pIVar14->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
          }
        }
        IVar4 = GetMouseDragDelta(1,-1.0);
        if ((((ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') &&
             (IVar4.x == 0.0)) && (!NAN(IVar4.x))) && ((IVar4.y == 0.0 && (!NAN(IVar4.y))))) {
          OpenPopupOnItemClick("context",1);
        }
        bVar7 = BeginPopup("context",0);
        if (bVar7) {
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            ImVector<ImVec2>::resize
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                       ShowExampleAppCustomRendering(bool*)::points + -2);
          }
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          bVar7 = MenuItem("Remove one",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if (bVar7) {
            ImVector<ImVec2>::resize
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                       ShowExampleAppCustomRendering(bool*)::points + -2);
          }
          bVar7 = MenuItem("Remove all",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if (bVar7) {
            ImVector<ImVec2>::clear
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
          }
          EndPopup();
        }
        ImDrawList::PushClipRect(pIVar16,(ImVec2)doc,gradient_size,true);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
          fVar32 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
          while (fVar32 < canvas_sz.x) {
            local_128._0_4_ = fVar32;
            local_f8.y = doc._4_4_;
            local_f8.x = doc._0_4_ + fVar32;
            local_f0.y = gradient_size.y;
            local_f0.x = doc._0_4_ + fVar32;
            ImDrawList::AddLine(pIVar16,&local_f8,&local_f0,0x28c8c8c8,1.0);
            fVar32 = (float)local_128._0_4_ + 64.0;
          }
          fVar32 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
          while (fVar32 < canvas_sz.y) {
            local_f8.y = doc._4_4_ + fVar32;
            local_f8.x = SUB84(doc,0);
            local_f0.y = doc._4_4_ + fVar32;
            local_f0.x = gradient_size.x;
            local_128._0_4_ = fVar32;
            ImDrawList::AddLine(pIVar16,&local_f8,&local_f0,0x28c8c8c8,1.0);
            fVar32 = (float)local_128._0_4_ + 64.0;
          }
        }
        for (lVar21 = 0; lVar21 < ShowExampleAppCustomRendering(bool*)::points; lVar21 = lVar21 + 2)
        {
          uVar1 = *(undefined8 *)(DAT_001aa390 + lVar21 * 8);
          local_f8.y = (float)((ulong)uVar1 >> 0x20) + fVar33;
          local_f8.x = (float)uVar1 + fVar31;
          uVar1 = *(undefined8 *)(DAT_001aa390 + 8 + lVar21 * 8);
          local_f0.y = (float)((ulong)uVar1 >> 0x20) + fVar33;
          local_f0.x = (float)uVar1 + fVar31;
          ImDrawList::AddLine(pIVar16,&local_f8,&local_f0,0xff00ffff,2.0);
        }
        ImDrawList::PopClipRect(pIVar16);
        EndTabItem();
      }
      bVar7 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar7) {
        Checkbox("Draw in Background draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
        SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        Checkbox("Draw in Foreground draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
        SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar4 = GetWindowPos();
        fStack_120 = (float)extraout_XMM0_Dc_01;
        local_128._0_4_ = IVar4.x;
        local_128._4_4_ = IVar4.y;
        fStack_11c = (float)extraout_XMM0_Dd_01;
        IVar4 = GetWindowSize();
        doc = (MyDocument *)
              CONCAT44(IVar4.y * 0.5 + (float)local_128._4_4_,IVar4.x * 0.5 + (float)local_128._0_4_
                      );
        if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
          pIVar16 = GetBackgroundDrawList();
          ImDrawList::AddCircle(pIVar16,(ImVec2 *)&doc,IVar4.x * 0.6,0xc80000ff,0,14.0);
        }
        if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
          pIVar16 = GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar16,(ImVec2 *)&doc,IVar4.y * 0.6,0xc800ff00,0,10.0);
        }
        EndTabItem();
      }
      EndTabBar();
    }
  }
  End();
LAB_00130405:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar10 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar10 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar35 = uVar10 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar35 = uVar10;
  }
  uVar10 = uVar35 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar10 = uVar35;
  }
  uVar35 = uVar10 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar35 = uVar10;
  }
  uVar10 = uVar35 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar10 = uVar35;
  }
  uVar35 = uVar10 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar35 = uVar10;
  }
  uVar10 = uVar35 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar10 = uVar35;
  }
  uVar35 = uVar10 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar35 = uVar10;
  }
  uVar10 = uVar35 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar10 = uVar35;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  pIVar15 = GetMainViewport();
  doc = (MyDocument *)CONCAT44((pIVar15->WorkPos).y + 20.0,(pIVar15->WorkPos).x + 650.0);
  canvas_sz.x = 0.0;
  canvas_sz.y = 0.0;
  SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
  doc = (MyDocument *)0x442a000044098000;
  SetNextWindowSize((ImVec2 *)&doc,4);
  bVar7 = Begin("Dear ImGui Demo",p_open,uVar10);
  if (bVar7) {
    fVar31 = GetFontSize();
    PushItemWidth(fVar31 * -12.0);
    bVar7 = BeginMenuBar();
    if (bVar7) {
      bVar7 = BeginMenu("Menu",true);
      if (bVar7) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x174,"Menu/File",GImGuiDemoMarkerCallbackUserData);
        }
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar7 = BeginMenu("Examples",true);
      if (bVar7) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x17a,"Menu/Examples",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar7 = BeginMenu("Tools",true);
      if (bVar7) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x18d,"Menu/Tools",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x19c,"Help",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Help",0);
    if (bVar7) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b3,"Configuration",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Configuration",0);
    if (bVar7) {
      pIVar14 = GetIO();
      bVar7 = TreeNode("Configuration##2");
      if (bVar7) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar14->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar14->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar14->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar14->ConfigFlags,0x10);
        if ((pIVar14->ConfigFlags & 0x10) != 0) {
          dVar3 = GetTime();
          fVar31 = fmodf((float)dVar3,0.4);
          if (fVar31 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          bVar7 = IsKeyPressed(0x20c,true);
          if (bVar7) {
            *(byte *)&pIVar14->ConfigFlags = (byte)pIVar14->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar14->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTrickleEventQueue",&pIVar14->ConfigInputTrickleEventQueue);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates."
                  );
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar14->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).")
        ;
        Checkbox("io.ConfigDragClickToInputText",&pIVar14->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar14->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar14->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar14->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1de,"Configuration/Backend Flags",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Backend Flags");
      if (bVar7) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        doc = (MyDocument *)CONCAT44(doc._4_4_,pIVar14->BackendFlags);
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)&doc,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)&doc,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)&doc,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)&doc,8);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f0,"Configuration/Style",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Style");
      if (bVar7) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f9,"Configuration/Capture, Logging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Capture/Logging");
      if (bVar7) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        doc = (MyDocument *)0x0;
        bVar7 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)&doc);
        if (bVar7) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x20d,"Window options",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Window options",0);
    if (bVar7) {
      doc = (MyDocument *)0x0;
      bVar7 = BeginTable("split",3,0,(ImVec2 *)&doc,0.0);
      if (bVar7) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xcb8,"Popups",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar7) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xcce,"Popups/Popups",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Popups");
      if (bVar7) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        doc = (MyDocument *)0x0;
        bVar7 = Button("Select..",(ImVec2 *)&doc);
        if (bVar7) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar26 = "<None>";
        }
        else {
          pcVar26 = (&PTR_anon_var_dwarf_59bf7_0019e540)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar26,(char *)0x0);
        bVar7 = BeginPopup("my_select_popup",0);
        if (bVar7) {
          Text("Aquarium");
          Separator();
          ppuVar30 = &PTR_anon_var_dwarf_59bf7_0019e540;
          for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
            doc = (MyDocument *)0x0;
            bVar7 = Selectable(*ppuVar30,false,0,(ImVec2 *)&doc);
            if (bVar7) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar21;
            }
            ppuVar30 = ppuVar30 + 1;
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar7 = Button("Toggle..",(ImVec2 *)&doc);
        if (bVar7) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar7 = BeginPopup("my_toggle_popup",0);
        if (bVar7) {
          pbVar23 = (bool *)&ShowDemoWindowPopups()::toggles;
          for (lVar21 = 0; lVar21 != 0x28; lVar21 = lVar21 + 8) {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_59bf7_0019e540 + lVar21),"",pbVar23,true);
            pbVar23 = pbVar23 + 1;
          }
          bVar7 = BeginMenu("Sub-menu",true);
          if (bVar7) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            SetTooltip("I am a tooltip over a popup");
          }
          doc = (MyDocument *)0x0;
          bVar7 = Button("Stacked Popup",(ImVec2 *)&doc);
          if (bVar7) {
            OpenPopup("another popup",0);
          }
          bVar7 = BeginPopup("another popup",0);
          if (bVar7) {
            pbVar23 = (bool *)&ShowDemoWindowPopups()::toggles;
            for (lVar21 = 0; lVar21 != 0x28; lVar21 = lVar21 + 8) {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_59bf7_0019e540 + lVar21),"",pbVar23,true
                      );
              pbVar23 = pbVar23 + 1;
            }
            bVar7 = BeginMenu("Sub-menu",true);
            if (bVar7) {
              MenuItem("Click me",(char *)0x0,false,true);
              doc = (MyDocument *)0x0;
              bVar7 = Button("Stacked Popup",(ImVec2 *)&doc);
              if (bVar7) {
                OpenPopup("another popup",0);
              }
              bVar7 = BeginPopup("another popup",0);
              if (bVar7) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar7 = Button("With a menu..",(ImVec2 *)&doc);
        if (bVar7) {
          OpenPopup("my_file_popup",0);
        }
        bVar7 = BeginPopup("my_file_popup",0x400);
        if (bVar7) {
          bVar7 = BeginMenuBar();
          if (bVar7) {
            bVar7 = BeginMenu("File",true);
            if (bVar7) {
              ShowExampleMenuFile();
              EndMenu();
            }
            bVar7 = BeginMenu("Edit",true);
            if (bVar7) {
              MenuItem("Dummy",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text("Hello from popup!");
          doc = (MyDocument *)0x0;
          Button("This is a dummy button..",(ImVec2 *)&doc);
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd2d,"Popups/Context menus",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Context menus");
      if (bVar7) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        for (lVar21 = 0; lVar21 != 0x28; lVar21 = lVar21 + 8) {
          pcVar26 = *(char **)((long)&PTR_anon_var_dwarf_59d47_0019e570 + lVar21);
          doc = (MyDocument *)0x0;
          Selectable(pcVar26,false,0,(ImVec2 *)&doc);
          bVar7 = BeginPopupContextItem((char *)0x0,1);
          if (bVar7) {
            Text("This a popup for \"%s\"!",pcVar26);
            doc = (MyDocument *)0x0;
            bVar7 = Button("Close",(ImVec2 *)&doc);
            if (bVar7) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            SetTooltip("Right-click to open popup");
          }
        }
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",
             SUB84((double)ShowDemoWindowPopups()::value,0));
        bVar7 = BeginPopupContextItem("my popup",1);
        if (bVar7) {
          doc = (MyDocument *)0x0;
          bVar7 = Selectable("Set to zero",false,0,(ImVec2 *)&doc);
          if (bVar7) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          doc = (MyDocument *)0x0;
          bVar7 = Selectable("Set to PI",false,0,(ImVec2 *)&doc);
          if (bVar7) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        doc = (MyDocument *)0x0;
        bVar7 = Button("(3) Or click this button",(ImVec2 *)&doc);
        if (bVar7) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf((char *)&doc,"Button: %s###Button",ShowDemoWindowPopups()::name);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        Button((char *)&doc,&canvas_sz);
        bVar7 = BeginPopupContextItem((char *)0x0,1);
        if (bVar7) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar7 = Button("Close",&canvas_sz);
          if (bVar7) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd82,"Popups/Modals",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Modals");
      if (bVar7) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        doc = (MyDocument *)0x0;
        bVar7 = Button("Delete..",(ImVec2 *)&doc);
        if (bVar7) {
          OpenPopup("Delete?",0);
        }
        pIVar15 = GetMainViewport();
        canvas_sz.x = (float)DAT_0016a330;
        canvas_sz.y = DAT_0016a330._4_4_;
        doc = (MyDocument *)
              CONCAT44((pIVar15->Size).y * canvas_sz.y + (pIVar15->Pos).y,
                       (pIVar15->Size).x * canvas_sz.x + (pIVar15->Pos).x);
        SetNextWindowPos((ImVec2 *)&doc,8,&canvas_sz);
        bVar7 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar7) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          PushStyleVar(0xb,&canvas_sz);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar7 = Button("OK",&canvas_sz);
          if (bVar7) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar7 = Button("Cancel",&canvas_sz);
          if (bVar7) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar7 = Button("Stacked modals..",&canvas_sz);
        if (bVar7) {
          OpenPopup("Stacked 1",0);
        }
        bVar7 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar7) {
          bVar7 = BeginMenuBar();
          if (bVar7) {
            bVar7 = BeginMenu("File",true);
            if (bVar7) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar7 = Button("Add another modal..",&canvas_sz);
          if (bVar7) {
            OpenPopup("Stacked 2",0);
          }
          gradient_size.x._0_1_ = 1;
          bVar7 = BeginPopupModal("Stacked 2",(bool *)&gradient_size,0);
          if (bVar7) {
            Text("Hello from Stacked The Second!");
            canvas_sz.x = 0.0;
            canvas_sz.y = 0.0;
            bVar7 = Button("Close",&canvas_sz);
            if (bVar7) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar7 = Button("Close",&canvas_sz);
          if (bVar7) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xdce,"Popups/Menus inside a regular window",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Menus inside a regular window");
      if (bVar7) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar7 = BeginMenu("Menu inside a regular window",true);
        if (bVar7) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x160d,"Filtering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Filtering",0);
    if (bVar7) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar24 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar24 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 8) {
        bVar7 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_5fd9e_0019e810 + lVar21),(char *)0x0
                          );
        if (bVar7) {
          BulletText("%s");
        }
      }
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x161f,"Inputs, Navigation & Focus",GImGuiDemoMarkerCallbackUserData);
    }
    bVar7 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar7) {
      auVar18 = (undefined1  [8])GetIO();
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1625,"Inputs, Navigation & Focus/Output",GImGuiDemoMarkerCallbackUserData);
      }
      SetNextItemOpen(true,2);
      bVar7 = TreeNode("Output");
      if (bVar7) {
        Text("io.WantCaptureMouse: %d",(ulong)((ImGuiIO *)auVar18)->WantCaptureMouse);
        Text("io.WantCaptureMouseUnlessPopupClose: %d",
             (ulong)((ImGuiIO *)auVar18)->WantCaptureMouseUnlessPopupClose);
        Text("io.WantCaptureKeyboard: %d",(ulong)((ImGuiIO *)auVar18)->WantCaptureKeyboard);
        Text("io.WantTextInput: %d",(ulong)((ImGuiIO *)auVar18)->WantTextInput);
        Text("io.WantSetMousePos: %d",(ulong)((ImGuiIO *)auVar18)->WantSetMousePos);
        Text("io.NavActive: %d, io.NavVisible: %d",(ulong)((ImGuiIO *)auVar18)->NavActive,
             (ulong)((ImGuiIO *)auVar18)->NavVisible);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1633,"Inputs, Navigation & Focus/Mouse State",GImGuiDemoMarkerCallbackUserData
                  );
      }
      bVar7 = TreeNode("Mouse State");
      if (bVar7) {
        bVar7 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar7) {
          Text("Mouse pos: (%g, %g)",SUB84((double)(((ImGuiIO *)auVar18)->MousePos).x,0),
               SUB84((double)(((ImGuiIO *)auVar18)->MousePos).y,0));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",SUB84((double)(((ImGuiIO *)auVar18)->MouseDelta).x,0));
        Text("Mouse down:");
        for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
          bVar7 = IsMouseDown((ImGuiMouseButton)lVar21);
          if (bVar7) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",SUB84((double)((ImGuiIO *)auVar18)->MouseDownDuration[lVar21],0)
                );
          }
        }
        Text("Mouse clicked:");
        for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
          bVar7 = IsMouseClicked(uVar10,false);
          if (bVar7) {
            SameLine(0.0,-1.0);
            uVar35 = GetMouseClickedCount(uVar10);
            Text("b%d (%d)",(ulong)uVar10,(ulong)uVar35);
          }
        }
        Text("Mouse released:");
        uVar25 = 0;
        while (iVar24 = (int)uVar25, iVar24 != 5) {
          bVar7 = IsMouseReleased(iVar24);
          if (bVar7) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar25);
          }
          uVar25 = (ulong)(iVar24 + 1);
        }
        Text("Mouse wheel: %.1f",SUB84((double)((ImGuiIO *)auVar18)->MouseWheel,0));
        Text("Pen Pressure: %.1f",SUB84((double)((ImGuiIO *)auVar18)->PenPressure,0));
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1646,"Inputs, Navigation & Focus/Keyboard, Gamepad & Navigation State",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Keyboard, Gamepad & Navigation State");
      if (bVar7) {
        Text("Keys down:");
        for (uVar10 = 0; uVar10 != 0x285; uVar10 = uVar10 + 1) {
          bVar7 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(uVar10);
          if ((!bVar7) && (bVar7 = IsKeyDown(uVar10), bVar7)) {
            SameLine(0.0,-1.0);
            pcVar26 = GetKeyName(uVar10);
            pIVar19 = GetKeyData(uVar10);
            Text("\"%s\" %d (%.02f secs)",SUB84((double)pIVar19->DownDuration,0),pcVar26,
                 (ulong)uVar10);
          }
        }
        Text("Keys pressed:");
        for (uVar10 = 0; uVar10 != 0x285; uVar10 = uVar10 + 1) {
          bVar7 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(uVar10);
          if ((!bVar7) && (bVar7 = IsKeyPressed(uVar10,true), bVar7)) {
            SameLine(0.0,-1.0);
            pcVar26 = GetKeyName(uVar10);
            Text("\"%s\" %d",pcVar26,(ulong)uVar10);
          }
        }
        Text("Keys released:");
        uVar25 = 0;
        while (iVar24 = (int)uVar25, iVar24 != 0x285) {
          bVar7 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(iVar24);
          if ((!bVar7) && (bVar7 = IsKeyReleased(iVar24), bVar7)) {
            SameLine(0.0,-1.0);
            pcVar26 = GetKeyName(iVar24);
            Text("\"%s\" %d",pcVar26,uVar25);
          }
          uVar25 = (ulong)(iVar24 + 1);
        }
        pcVar26 = "CTRL ";
        if (((ImGuiIO *)auVar18)->KeyCtrl == false) {
          pcVar26 = "";
        }
        pcVar27 = "SHIFT ";
        if (((ImGuiIO *)auVar18)->KeyShift == false) {
          pcVar27 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar26,pcVar27);
        Text("Chars queue:");
        for (lVar21 = 0; lVar21 < (((ImGuiIO *)auVar18)->InputQueueCharacters).Size;
            lVar21 = lVar21 + 1) {
          uVar2 = (((ImGuiIO *)auVar18)->InputQueueCharacters).Data[lVar21];
          SameLine(0.0,-1.0);
          uVar25 = (ulong)(uint)(int)(char)uVar2;
          if (0xde < (ushort)(uVar2 - 0x21)) {
            uVar25 = 0x3f;
          }
          Text("\'%c\' (0x%04X)",uVar25,(ulong)uVar2);
        }
        Text("NavInputs down:");
        for (uVar25 = 0; uVar25 != 0x14; uVar25 = uVar25 + 1) {
          if (0.0 < ((ImGuiIO *)auVar18)->NavInputs[uVar25]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",SUB84((double)((ImGuiIO *)auVar18)->NavInputs[uVar25],0),
                 uVar25 & 0xffffffff);
          }
        }
        Text("NavInputs pressed:");
        for (uVar25 = 0; uVar25 != 0x14; uVar25 = uVar25 + 1) {
          if ((((ImGuiIO *)auVar18)->NavInputsDownDuration[uVar25] == 0.0) &&
             (!NAN(((ImGuiIO *)auVar18)->NavInputsDownDuration[uVar25]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar25 & 0xffffffff);
          }
        }
        local_48 = auVar18;
        IVar4 = GetCursorScreenPos();
        fVar31 = IVar4.x;
        fVar33 = IVar4.y;
        local_108.x = fVar31 + 102.0 + 18.0 + 10.0;
        local_108.y = fVar33 + 102.0 + 10.0;
        local_128._0_4_ = fVar31 + 5.0 + -34.0;
        pIVar16 = GetWindowDrawList();
        ImDrawList::PushClipRect(pIVar16,IVar4,local_108,true);
        for (lVar21 = 0x10; lVar21 != 0x178; lVar21 = lVar21 + 0x18) {
          fVar32 = (float)*(int *)((long)&PTR_anon_var_dwarf_5fde6_0019e840 + lVar21) * 9.0 +
                   (float)*(int *)((long)&PTR_anon_var_dwarf_5fde6_0019e840 + lVar21 + 4) * 34.0 +
                   (float)local_128._0_4_;
          fVar34 = (float)*(int *)((long)&PTR_anon_var_dwarf_5fde6_0019e840 + lVar21) * 34.0 +
                   fVar33;
          doc = (MyDocument *)CONCAT44(fVar34,fVar32);
          canvas_sz.x = fVar32 + 35.0;
          canvas_sz.y = fVar34 + 35.0;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,0xffcccccc,3.0,0);
          ImDrawList::AddRect(pIVar16,(ImVec2 *)&doc,&canvas_sz,0xff181818,3.0,0,1.0);
          fVar32 = SUB84(doc,0) + 5.0;
          fVar34 = (float)((ulong)doc >> 0x20) + 3.0;
          gradient_size.y = fVar34;
          gradient_size.x = fVar32;
          local_e8.y = fVar34 + 25.0;
          local_e8.x = fVar32 + 25.0;
          ImDrawList::AddRect(pIVar16,&gradient_size,&local_e8,0xffc1c1c1,2.0,0,2.0);
          ImDrawList::AddRectFilled(pIVar16,&gradient_size,&local_e8,0xfffcfcfc,2.0,0);
          local_f8.y = (float)((ulong)doc >> 0x20) + 4.0;
          local_f8.x = SUB84(doc,0) + 7.0;
          ImDrawList::AddText(pIVar16,&local_f8,0xff404040,
                              *(char **)((long)&PTR_anon_var_dwarf_5fdf2_0019e848 + lVar21),
                              (char *)0x0);
          bVar7 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0019e850 + lVar21));
          if (bVar7) {
            ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)&doc,&canvas_sz,0x800000ff,3.0,0);
          }
        }
        ImDrawList::PopClipRect(pIVar16);
        doc = (MyDocument *)CONCAT44(local_108.y - fVar33,local_108.x - fVar31);
        Dummy((ImVec2 *)&doc);
        TreePop();
        auVar18 = local_48;
      }
      bVar7 = TreeNode("Capture override");
      if (bVar7) {
        doc = (MyDocument *)0x0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)&doc);
        bVar7 = IsItemHovered(0);
        if (bVar7) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)&doc);
        bVar7 = IsItemActive();
        if (bVar7) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1696,"Inputs, Navigation & Focus/Tabbing",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Tabbing");
      if (bVar7) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16a6,"Inputs, Navigation & Focus/Focus from code",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Focus from code");
      if (bVar7) {
        doc = (MyDocument *)0x0;
        bVar7 = Button("Focus on 1",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar8 = Button("Focus on 2",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar9 = Button("Focus on 3",(ImVec2 *)&doc);
        if (bVar7) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar7 = IsItemActive();
        if (bVar8) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar8 = IsItemActive();
        uVar10 = (uint)bVar7;
        if (bVar8) {
          uVar10 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar9) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar7 = IsItemActive();
        if (bVar7) {
          uVar10 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar10 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar10);
        }
        doc = (MyDocument *)0x0;
        bVar7 = Button("Focus on X",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar8 = Button("Focus on Y",(ImVec2 *)&doc);
        uVar10 = bVar7 - 1;
        if (bVar8) {
          uVar10 = 1;
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar7 = Button("Focus on Z",(ImVec2 *)&doc);
        if (bVar7) {
          uVar10 = 2;
        }
        if (uVar10 != 0xffffffff) {
          SetKeyboardFocusHere(uVar10);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16d0,"Inputs, Navigation & Focus/Dragging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Dragging");
      if (bVar7) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
          Text("IsMouseDragging(%d):",(ulong)uVar10);
          bVar7 = IsMouseDragging(uVar10,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar7);
          bVar7 = IsMouseDragging(uVar10,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar7);
          bVar7 = IsMouseDragging(uVar10,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar7);
        }
        doc = (MyDocument *)0x0;
        Button("Drag Me",(ImVec2 *)&doc);
        bVar7 = IsItemActive();
        if (bVar7) {
          pIVar16 = GetForegroundDrawList();
          IVar11 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar16,((ImGuiIO *)auVar18)->MouseClickedPos,
                              &((ImGuiIO *)auVar18)->MousePos,IVar11,4.0);
        }
        IVar4 = GetMouseDragDelta(0,0.0);
        IVar5 = GetMouseDragDelta(0,-1.0);
        uStack_40 = extraout_XMM0_Dc_02;
        local_48._0_4_ = IVar5.x;
        local_48._4_4_ = IVar5.y;
        uStack_3c = extraout_XMM0_Dd_02;
        fVar31 = (((ImGuiIO *)auVar18)->MouseDelta).x;
        local_128 = (undefined1  [8])(double)(((ImGuiIO *)auVar18)->MouseDelta).y;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",SUB84((double)(float)local_48._0_4_,0),
             SUB84((double)(float)local_48._4_4_,0));
        local_108.x = IVar4.x;
        local_108.y = IVar4.y;
        Text("  w/ zero threshold: (%.1f, %.1f)",SUB84((double)local_108.x,0),
             SUB84((double)local_108.y,0));
        Text("io.MouseDelta: (%.1f, %.1f)",SUB84((double)fVar31,0),local_128._0_4_);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16ed,"Inputs, Navigation & Focus/Mouse cursors",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar7 = TreeNode("Mouse cursors");
      if (bVar7) {
        IVar13 = GetMouseCursor();
        puVar28 = &DAT_0019e9c0;
        Text("Current mouse cursor = %d: %s",(long)IVar13,(&DAT_0019e9c0)[IVar13]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        for (uVar25 = 0; uVar25 != 9; uVar25 = uVar25 + 1) {
          sprintf((char *)&doc,"Mouse cursor %d: %s",uVar25 & 0xffffffff,*puVar28);
          Bullet();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          Selectable((char *)&doc,false,0,&canvas_sz);
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            SetMouseCursor((ImGuiMouseCursor)uVar25);
          }
          puVar28 = puVar28 + 1;
        }
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            IMGUI_DEMO_MARKER("Menu/File");
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            IMGUI_DEMO_MARKER("Menu/Examples");
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
            IMGUI_DEMO_MARKER("Menu/Tools");
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    IMGUI_DEMO_MARKER("Help");
    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    IMGUI_DEMO_MARKER("Configuration");
    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGuiKey_Space))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTrickleEventQueue", &io.ConfigInputTrickleEventQueue);
            ImGui::SameLine(); HelpMarker("Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Backend Flags");
        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            // FIXME: We don't use BeginDisabled() to keep label bright, maybe we need a BeginReadonly() equivalent..
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Style");
        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Capture, Logging");
        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    IMGUI_DEMO_MARKER("Window options");
    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}